

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbols.h
# Opt level: O1

QSet<QByteArray> __thiscall SymbolStack::excludeSymbols(SymbolStack *this)

{
  ulong uVar1;
  ulong uVar2;
  long lVar3;
  Data *pDVar4;
  long in_RSI;
  long lVar5;
  SafeSymbols *sf;
  long lVar6;
  ulong uVar7;
  long in_FS_OFFSET;
  QHashDummyValue local_3a;
  QHashDummyValue local_39;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (this->super_QStack<SafeSymbols>).super_QList<SafeSymbols>.d.d = (Data *)0x0;
  if (*(long *)(in_RSI + 0x10) != 0) {
    lVar6 = *(long *)(in_RSI + 8);
    lVar5 = *(long *)(in_RSI + 0x10) * 0x40 + lVar6;
    do {
      QHash<QByteArray,QHashDummyValue>::emplace<QHashDummyValue_const&>
                ((QHash<QByteArray,QHashDummyValue> *)this,(QByteArray *)(lVar6 + 0x18),&local_3a);
      pDVar4 = *(Data **)(lVar6 + 0x30);
      if ((this->super_QStack<SafeSymbols>).super_QList<SafeSymbols>.d.d != pDVar4) {
        if (pDVar4 == (Data *)0x0) {
LAB_0013f2e4:
          pDVar4 = (Data *)0x0;
LAB_0013f2e6:
          uVar7 = 0;
        }
        else {
          if (**(char **)&pDVar4[2].super_QArrayData != -1) goto LAB_0013f2e6;
          uVar1._0_4_ = pDVar4[1].super_QArrayData.ref_;
          uVar1._4_4_ = pDVar4[1].super_QArrayData.flags;
          uVar2 = 1;
          do {
            uVar7 = uVar2;
            if (uVar1 == uVar7) goto LAB_0013f2e4;
            uVar2 = uVar7 + 1;
          } while ((*(char **)&pDVar4[2].super_QArrayData)
                   [(ulong)((uint)uVar7 & 0x7f) + (uVar7 >> 7) * 0x90] == -1);
        }
        if (pDVar4 != (Data *)0x0 || uVar7 != 0) {
          do {
            lVar3 = (uVar7 >> 7) * 0x90;
            QHash<QByteArray,QHashDummyValue>::emplace<QHashDummyValue_const&>
                      ((QHash<QByteArray,QHashDummyValue> *)this,
                       (QByteArray *)
                       ((ulong)((uint)*(byte *)((ulong)((uint)uVar7 & 0x7f) +
                                               *(long *)&pDVar4[2].super_QArrayData + lVar3) * 0x18)
                       + *(long *)(*(long *)&pDVar4[2].super_QArrayData + 0x80 + lVar3)),&local_39);
            do {
              if (*(long *)&pDVar4[1].super_QArrayData - 1U == uVar7) {
                uVar7 = 0;
                pDVar4 = (Data *)0x0;
                break;
              }
              uVar7 = uVar7 + 1;
            } while (*(char *)((ulong)((uint)uVar7 & 0x7f) +
                              (uVar7 >> 7) * 0x90 + *(long *)&pDVar4[2].super_QArrayData) == -1);
          } while ((uVar7 != 0) || (pDVar4 != (Data *)0x0));
        }
      }
      lVar6 = lVar6 + 0x40;
    } while (lVar6 != lVar5);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (QSet<QByteArray>)(Hash)this;
}

Assistant:

inline QSet<QByteArray> SymbolStack::excludeSymbols() const
{
    QSet<QByteArray> set;
    for (const SafeSymbols &sf : *this) {
        set << sf.expandedMacro;
        set += sf.excludedSymbols;
    }
    return set;
}